

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O2

bool __thiscall
matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>::
matchValue<std::shared_ptr<mathiu::impl::Expr_const>>
          (Id<std::shared_ptr<mathiu::impl::Expr_const>> *this,
          shared_ptr<const_mathiu::impl::Expr> *v)

{
  bool bVar1;
  shared_ptr<const_mathiu::impl::Expr> *lhs;
  BlockT *pBVar2;
  
  bVar1 = Id<std::shared_ptr<const_mathiu::impl::Expr>_>::hasValue
                    ((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)this);
  if (bVar1) {
    lhs = Id<std::shared_ptr<const_mathiu::impl::Expr>_>::internalValue
                    ((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)this);
    bVar1 = mathiu::impl::equal(lhs,v);
    return bVar1;
  }
  pBVar2 = Id<std::shared_ptr<const_mathiu::impl::Expr>_>::block
                     ((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)this);
  IdUtil<std::shared_ptr<mathiu::impl::Expr_const>>::
  bindValue<std::shared_ptr<mathiu::impl::Expr_const>>
            (&(pBVar2->super_IdBlockBase<std::shared_ptr<const_mathiu::impl::Expr>_>).mVariant,v);
  return true;
}

Assistant:

constexpr auto
                matchValue(Value &&v) const
            {
                if (hasValue())
                {
                    return IdTraits<std::decay_t<Type>>::equal(internalValue(), v);
                }
                IdUtil<Type>::bindValue(block().variant(), std::forward<Value>(v),
                                   StorePointer<Type, Value>{});
                return true;
            }